

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1509.c
# Opt level: O1

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  long headerSize;
  undefined8 local_30;
  
  iVar1 = curl_global_init(3);
  uVar7 = _stderr;
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                  ,0x28,iVar1,uVar3);
  }
  if (iVar1 != 0) {
    return iVar1;
  }
  lVar4 = curl_easy_init();
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                  ,0x2a);
    iVar1 = 0x7c;
  }
  else {
    iVar2 = curl_easy_setopt(lVar4,0x2714,libtest_arg2);
    uVar7 = _stderr;
    iVar1 = 0;
    if (iVar2 != 0) {
      uVar3 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                    ,0x2c,iVar2,uVar3);
      iVar1 = iVar2;
    }
    if (iVar1 == 0) {
      iVar2 = curl_easy_setopt(lVar4,0x4e2b,WriteOutput);
      uVar7 = _stderr;
      iVar1 = 0;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                      ,0x2e,iVar2,uVar3);
        iVar1 = iVar2;
      }
      if (iVar1 == 0) {
        iVar2 = curl_easy_setopt(lVar4,0x4e6f,WriteHeader);
        uVar7 = _stderr;
        iVar1 = 0;
        if (iVar2 != 0) {
          uVar3 = curl_easy_strerror(iVar2);
          curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                        ,0x2f,iVar2,uVar3);
          iVar1 = iVar2;
        }
        if (iVar1 == 0) {
          iVar2 = curl_easy_setopt(lVar4,0x2a,1);
          uVar7 = _stderr;
          iVar1 = 0;
          if (iVar2 != 0) {
            uVar3 = curl_easy_strerror(iVar2);
            curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                          ,0x31,iVar2,uVar3);
            iVar1 = iVar2;
          }
          if (iVar1 == 0) {
            iVar2 = curl_easy_setopt(lVar4,0x29,1);
            uVar7 = _stderr;
            iVar1 = 0;
            if (iVar2 != 0) {
              uVar3 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                            ,0x32,iVar2,uVar3);
              iVar1 = iVar2;
            }
            if (iVar1 == 0) {
              iVar2 = curl_easy_setopt(lVar4,0x2712,URL);
              uVar7 = _stderr;
              iVar1 = 0;
              if (iVar2 != 0) {
                uVar3 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                              ,0x33,iVar2,uVar3);
                iVar1 = iVar2;
              }
              if (iVar1 == 0) {
                iVar2 = curl_easy_setopt(lVar4,0x3d,1);
                uVar7 = _stderr;
                iVar1 = 0;
                if (iVar2 != 0) {
                  uVar3 = curl_easy_strerror(iVar2);
                  curl_mfprintf(uVar7,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                                ,0x34,iVar2,uVar3);
                  iVar1 = iVar2;
                }
                if (iVar1 == 0) {
                  iVar2 = curl_easy_perform(lVar4);
                  uVar7 = _stderr;
                  if (iVar2 == 0) {
                    iVar1 = 0;
                    iVar2 = curl_easy_getinfo(lVar4,0x20000b,&local_30);
                    uVar7 = _stderr;
                    if (iVar2 == 0) {
                      curl_mprintf("header length is ........: %lu\n",local_30);
                      curl_mprintf("header length should be..: %lu\n",realHeaderSize);
                      goto LAB_001025ef;
                    }
                    uVar3 = curl_easy_strerror(iVar2);
                    pcVar6 = "%s:%d curl_easy_getinfo() failed, with code %d (%s)\n";
                    uVar5 = 0x43;
                  }
                  else {
                    uVar3 = curl_easy_strerror(iVar2);
                    pcVar6 = "%s:%d curl_easy_perform() failed, with code %d (%s)\n";
                    uVar5 = 0x3a;
                  }
                  curl_mfprintf(uVar7,pcVar6,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1509.c"
                                ,uVar5,iVar2,uVar3);
                  iVar1 = 0x7e;
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001025ef:
  curl_easy_cleanup(lVar4);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  long headerSize;
  CURLcode code;
  CURL *curl = NULL;
  int res = 0;

  global_init(CURL_GLOBAL_ALL);

  easy_init(curl);

  easy_setopt(curl, CURLOPT_PROXY, libtest_arg2); /* set in first.c */

  easy_setopt(curl, CURLOPT_WRITEFUNCTION, *WriteOutput);
  easy_setopt(curl, CURLOPT_HEADERFUNCTION, *WriteHeader);

  easy_setopt(curl, CURLOPT_HEADER, 1L);
  easy_setopt(curl, CURLOPT_VERBOSE, 1L);
  easy_setopt(curl, CURLOPT_URL, URL);
  easy_setopt(curl, CURLOPT_HTTPPROXYTUNNEL, 1L);

  code = curl_easy_perform(curl);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_perform() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  code = curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &headerSize);
  if(CURLE_OK != code) {
    fprintf(stderr, "%s:%d curl_easy_getinfo() failed, "
            "with code %d (%s)\n",
            __FILE__, __LINE__, (int)code, curl_easy_strerror(code));
    res = TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  printf("header length is ........: %lu\n", headerSize);
  printf("header length should be..: %lu\n", realHeaderSize);

test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return res;
}